

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddOr(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte bVar1;
  LogEst a;
  LogEst a_00;
  int iVar2;
  WhereClause *pWVar3;
  WhereLoop *pWVar4;
  SrcList *pSVar5;
  WhereOrInfo *pWVar6;
  ulong uVar7;
  u16 uVar8;
  LogEst rRun;
  LogEst nOut;
  ulong uVar9;
  WhereTerm *pWVar10;
  WhereTerm *pWVar11;
  ulong uVar12;
  WhereTerm *pWVar13;
  WhereTerm *pWVar14;
  ulong uVar15;
  LogEst *pLVar16;
  ulong uVar17;
  bool bVar18;
  WhereOrSet sSum;
  WhereOrSet sCur;
  WhereClause tempWC;
  int local_3a4;
  WhereOrSet local_338;
  WhereLoopBuilder local_2f8;
  WhereOrSet local_2c8;
  ulong local_288;
  LogEst aLStack_280 [20];
  WhereInfo *local_258;
  WhereClause *local_250;
  undefined1 local_248;
  undefined4 local_244;
  WhereTerm *local_238;
  
  pWVar3 = pBuilder->pWC;
  pWVar4 = pBuilder->pNew;
  pWVar13 = pWVar3->a;
  local_338.a[1].rRun = 0;
  local_338.a[1].nOut = 0;
  local_338.a[1]._12_4_ = 0;
  local_338.a[2].prereq = 0;
  local_338.a[0].rRun = 0;
  local_338.a[0].nOut = 0;
  local_338.a[0]._12_4_ = 0;
  local_338.a[1].prereq = 0;
  local_338._0_8_ = 0;
  local_338.a[0].prereq = 0;
  local_338.a[2].rRun = 0;
  local_338.a[2].nOut = 0;
  local_338.a[2]._12_4_ = 0;
  if ((long)pWVar3->nTerm < 1) {
    local_3a4 = 0;
  }
  else {
    pWVar10 = pWVar13 + pWVar3->nTerm;
    bVar1 = pWVar4->iTab;
    pSVar5 = pBuilder->pWInfo->pTabList;
    iVar2 = pSVar5->a[bVar1].iCursor;
    uVar15 = 0;
    do {
      if ((pWVar13->eOperator & 0x200) == 0) {
        local_3a4 = 0;
      }
      else {
        pWVar6 = (pWVar13->u).pOrInfo;
        if ((pWVar6->indexable & pWVar4->maskSelf) == 0) {
          local_3a4 = 0;
        }
        else {
          pWVar14 = (pWVar6->wc).a + (pWVar6->wc).nTerm;
          local_2f8.pNew = pBuilder->pNew;
          local_2f8.bldFlags = pBuilder->bldFlags;
          local_2f8._44_4_ = *(undefined4 *)&pBuilder->field_0x2c;
          local_2f8.pWInfo._0_4_ = *(undefined4 *)&pBuilder->pWInfo;
          local_2f8.pWInfo._4_4_ = *(undefined4 *)((long)&pBuilder->pWInfo + 4);
          local_2f8.pWC = pBuilder->pWC;
          local_2f8.pOrderBy = (ExprList *)0x0;
          local_2f8.pOrSet = &local_2c8;
          pWVar11 = (pWVar6->wc).a;
          local_3a4 = 0;
          if (pWVar11 < pWVar14) {
            local_3a4 = 0;
            bVar18 = true;
            do {
              if ((pWVar11->eOperator & 0x400) == 0) {
                if (pWVar11->leftCursor == iVar2) {
                  local_258 = pWVar3->pWInfo;
                  local_248 = 0x47;
                  local_244 = 1;
                  local_2f8.pWC = (WhereClause *)&local_258;
                  local_250 = pWVar3;
                  local_238 = pWVar11;
                  goto LAB_00172c7f;
                }
              }
              else {
                local_2f8.pWC = *(WhereClause **)&pWVar11->u;
LAB_00172c7f:
                local_2c8.n = 0;
                if ((pSVar5->a[bVar1].pTab)->nModuleArg == 0) {
                  local_3a4 = whereLoopAddBtree(&local_2f8,mPrereq);
                }
                else {
                  local_3a4 = whereLoopAddVirtual(&local_2f8,mPrereq,mUnusable);
                }
                if (local_3a4 == 0) {
                  local_3a4 = whereLoopAddOr(&local_2f8,mPrereq,mUnusable);
                }
                if (local_2c8.n == 0) {
                  local_338._0_8_ = (ulong)(uint6)local_338._2_6_ << 0x10;
                  uVar15 = 0;
                  goto LAB_00172e51;
                }
                if (bVar18) {
                  local_338.n = local_2c8.n;
                  memcpy(local_338.a,local_2c8.a,(ulong)local_2c8.n << 4);
                }
                else {
                  uVar8 = local_338.n;
                  uVar15 = local_338._0_8_ & 0xffff;
                  memcpy(&local_288,local_338.a,(local_338._0_8_ & 0xffff) << 4);
                  local_338._0_8_ = local_338._0_8_ & 0xffffffffffff0000;
                  if (uVar8 != 0) {
                    uVar9 = 1;
                    uVar12 = 0;
                    do {
                      if ((short)uVar9 == 0) {
                        uVar9 = 0;
                      }
                      else {
                        uVar7 = (&local_288)[uVar12 * 2];
                        a = aLStack_280[uVar12 * 8];
                        a_00 = aLStack_280[uVar12 * 8 + 1];
                        pLVar16 = &local_2c8.a[0].nOut;
                        uVar17 = 0;
                        do {
                          uVar9 = ((WhereOrCost *)(pLVar16 + -5))->prereq;
                          rRun = sqlite3LogEstAdd(a,pLVar16[-1]);
                          nOut = sqlite3LogEstAdd(a_00,*pLVar16);
                          whereOrInsert(&local_338,uVar9 | uVar7,rRun,nOut);
                          uVar17 = uVar17 + 1;
                          uVar9 = (ulong)local_2c8.n;
                          pLVar16 = pLVar16 + 8;
                        } while (uVar17 < uVar9);
                      }
                      uVar12 = uVar12 + 1;
                    } while (uVar12 != uVar15);
                  }
                }
                bVar18 = false;
              }
              pWVar11 = pWVar11 + 1;
            } while (pWVar11 < pWVar14);
            uVar15 = local_338._0_8_ & 0xffff;
          }
LAB_00172e51:
          pWVar4->nLTerm = 1;
          *pWVar4->aLTerm = pWVar13;
          pWVar4->wsFlags = 0x2000;
          pWVar4->rSetup = 0;
          pWVar4->iSortIdx = '\0';
          *(undefined8 *)&pWVar4->u = 0;
          (pWVar4->u).btree.pIndex = (Index *)0x0;
          if ((short)uVar15 != 0 && local_3a4 == 0) {
            pLVar16 = &local_338.a[0].nOut;
            uVar9 = 1;
            do {
              pWVar4->rRun = (short)*(undefined4 *)(pLVar16 + -1) + 1;
              pWVar4->nOut = *pLVar16;
              pWVar4->prereq = ((WhereOrCost *)(pLVar16 + -5))->prereq;
              local_3a4 = whereLoopInsert((WhereLoopBuilder *)pBuilder->pWInfo,
                                          (WhereLoop *)pBuilder->pOrSet);
              if (local_3a4 != 0) break;
              pLVar16 = pLVar16 + 8;
              bVar18 = uVar9 < uVar15;
              uVar9 = uVar9 + 1;
            } while (bVar18);
          }
        }
      }
    } while ((local_3a4 == 0) && (pWVar13 = pWVar13 + 1, pWVar13 < pWVar10));
  }
  return local_3a4;
}

Assistant:

static int whereLoopAddOr(
  WhereLoopBuilder *pBuilder, 
  Bitmask mPrereq, 
  Bitmask mUnusable
){
  WhereInfo *pWInfo = pBuilder->pWInfo;
  WhereClause *pWC;
  WhereLoop *pNew;
  WhereTerm *pTerm, *pWCEnd;
  int rc = SQLITE_OK;
  int iCur;
  WhereClause tempWC;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sSum, sCur;
  struct SrcList_item *pItem;
  
  pWC = pBuilder->pWC;
  pWCEnd = pWC->a + pWC->nTerm;
  pNew = pBuilder->pNew;
  memset(&sSum, 0, sizeof(sSum));
  pItem = pWInfo->pTabList->a + pNew->iTab;
  iCur = pItem->iCursor;

  for(pTerm=pWC->a; pTerm<pWCEnd && rc==SQLITE_OK; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && (pTerm->u.pOrInfo->indexable & pNew->maskSelf)!=0 
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int once = 1;
      int i, j;
    
      sSubBuild = *pBuilder;
      sSubBuild.pOrderBy = 0;
      sSubBuild.pOrSet = &sCur;

      WHERETRACE(0x200, ("Begin processing OR-clause %p\n", pTerm));
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        if( (pOrTerm->eOperator & WO_AND)!=0 ){
          sSubBuild.pWC = &pOrTerm->u.pAndInfo->wc;
        }else if( pOrTerm->leftCursor==iCur ){
          tempWC.pWInfo = pWC->pWInfo;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.nTerm = 1;
          tempWC.a = pOrTerm;
          sSubBuild.pWC = &tempWC;
        }else{
          continue;
        }
        sCur.n = 0;
#ifdef WHERETRACE_ENABLED
        WHERETRACE(0x200, ("OR-term %d of %p has %d subterms:\n", 
                   (int)(pOrTerm-pOrWC->a), pTerm, sSubBuild.pWC->nTerm));
        if( sqlite3WhereTrace & 0x400 ){
          sqlite3WhereClausePrint(sSubBuild.pWC);
        }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(pItem->pTab) ){
          rc = whereLoopAddVirtual(&sSubBuild, mPrereq, mUnusable);
        }else
#endif
        {
          rc = whereLoopAddBtree(&sSubBuild, mPrereq);
        }
        if( rc==SQLITE_OK ){
          rc = whereLoopAddOr(&sSubBuild, mPrereq, mUnusable);
        }
        assert( rc==SQLITE_OK || sCur.n==0 );
        if( sCur.n==0 ){
          sSum.n = 0;
          break;
        }else if( once ){
          whereOrMove(&sSum, &sCur);
          once = 0;
        }else{
          WhereOrSet sPrev;
          whereOrMove(&sPrev, &sSum);
          sSum.n = 0;
          for(i=0; i<sPrev.n; i++){
            for(j=0; j<sCur.n; j++){
              whereOrInsert(&sSum, sPrev.a[i].prereq | sCur.a[j].prereq,
                            sqlite3LogEstAdd(sPrev.a[i].rRun, sCur.a[j].rRun),
                            sqlite3LogEstAdd(sPrev.a[i].nOut, sCur.a[j].nOut));
            }
          }
        }
      }
      pNew->nLTerm = 1;
      pNew->aLTerm[0] = pTerm;
      pNew->wsFlags = WHERE_MULTI_OR;
      pNew->rSetup = 0;
      pNew->iSortIdx = 0;
      memset(&pNew->u, 0, sizeof(pNew->u));
      for(i=0; rc==SQLITE_OK && i<sSum.n; i++){
        /* TUNING: Currently sSum.a[i].rRun is set to the sum of the costs
        ** of all sub-scans required by the OR-scan. However, due to rounding
        ** errors, it may be that the cost of the OR-scan is equal to its
        ** most expensive sub-scan. Add the smallest possible penalty 
        ** (equivalent to multiplying the cost by 1.07) to ensure that 
        ** this does not happen. Otherwise, for WHERE clauses such as the
        ** following where there is an index on "y":
        **
        **     WHERE likelihood(x=?, 0.99) OR y=?
        **
        ** the planner may elect to "OR" together a full-table scan and an
        ** index lookup. And other similarly odd results.  */
        pNew->rRun = sSum.a[i].rRun + 1;
        pNew->nOut = sSum.a[i].nOut;
        pNew->prereq = sSum.a[i].prereq;
        rc = whereLoopInsert(pBuilder, pNew);
      }
      WHERETRACE(0x200, ("End processing OR-clause %p\n", pTerm));
    }
  }
  return rc;
}